

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O1

void Abc_NtkCecFraigPartAuto(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nSeconds,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *vOuts;
  void *__ptr;
  Abc_Ntk_t *pAVar5;
  int iVar6;
  Abc_Ntk_t *pMiter;
  int *piVar7;
  Abc_Frame_t *pAVar8;
  Vec_Ptr_t *__ptr_00;
  Vec_Ptr_t *vOutsPtr;
  void **ppvVar9;
  char *pcVar10;
  size_t __size;
  long lVar11;
  Abc_Ntk_t *pMiterPart;
  Prove_Params_t Params;
  int local_b8;
  uint local_b4;
  Abc_Ntk_t *local_b0;
  Vec_Ptr_t *local_a8;
  Abc_Ntk_t *local_a0;
  Abc_Ntk_t *local_98;
  Vec_Int_t *local_90;
  Prove_Params_t local_88;
  
  Prove_ParamsSetDefault(&local_88);
  local_88.nItersMax = 5;
  pMiter = Abc_NtkMiter(pNtk1,pNtk2,1,1,0,0);
  if (pMiter == (Abc_Ntk_t *)0x0) {
    puts("Miter computation has failed.");
    return;
  }
  iVar6 = Abc_NtkMiterIsConstant(pMiter);
  if (iVar6 == 1) {
    pcVar10 = "Networks are equivalent after structural hashing.";
  }
  else {
    if (iVar6 == 0) {
      puts("Networks are NOT EQUIVALENT after structural hashing.");
      __size = (long)pMiter->vCis->nSize << 2;
      piVar7 = (int *)malloc(__size);
      memset(piVar7,0,__size);
      pMiter->pModel = piVar7;
      Abc_NtkVerifyReportError(pNtk1,pNtk2,piVar7);
      if (pMiter->pModel != (int *)0x0) {
        free(pMiter->pModel);
        pMiter->pModel = (int *)0x0;
      }
      goto LAB_0031e29c;
    }
    local_98 = pNtk1;
    pAVar8 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar8,"unset progressbar");
    __ptr_00 = Abc_NtkPartitionSmart(pMiter,300,0);
    vOutsPtr = (Vec_Ptr_t *)malloc(0x10);
    vOutsPtr->nCap = 1000;
    vOutsPtr->nSize = 0;
    ppvVar9 = (void **)malloc(8000);
    vOutsPtr->pArray = ppvVar9;
    if (__ptr_00->nSize < 1) {
      local_b4 = 0;
      local_b8 = 1;
    }
    else {
      local_b8 = 1;
      lVar11 = 0;
      local_b4 = 0;
      local_a8 = vOutsPtr;
      local_a0 = pMiter;
      do {
        vOuts = (Vec_Int_t *)__ptr_00->pArray[lVar11];
        Abc_NtkConvertCos(pMiter,vOuts,vOutsPtr);
        local_b0 = Abc_NtkCreateConeArray(pMiter,vOutsPtr,0);
        Abc_NtkCombinePos(local_b0,0,0);
        iVar6 = Abc_NtkMiterIsConstant(local_b0);
        if (iVar6 != 1) {
          if (iVar6 == 0) {
            puts("Networks are NOT EQUIVALENT after partitioning.");
LAB_0031e1c5:
            Abc_NtkDelete(local_b0);
            break;
          }
          uVar1 = __ptr_00->nSize;
          uVar2 = local_b0->vPis->nSize;
          uVar3 = local_b0->vPos->nSize;
          uVar4 = local_b0->nObjCounts[7];
          local_90 = vOuts;
          iVar6 = Abc_AigLevel(local_b0);
          printf("Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
                 (ulong)((int)lVar11 + 1),(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,iVar6)
          ;
          fflush(_stdout);
          iVar6 = Abc_NtkIvyProve(&local_b0,&local_88);
          if (iVar6 == -1) {
            printf("Networks are undecided (resource limits is reached).\r");
            local_b8 = -1;
            pMiter = local_a0;
            vOutsPtr = local_a8;
          }
          else {
            if (iVar6 == 0) {
              piVar7 = Abc_NtkVerifySimulatePattern(local_b0,local_b0->pModel);
              pcVar10 = "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.";
              if (*piVar7 == 1) {
                pcVar10 = "Networks are NOT EQUIVALENT.                 ";
              }
              puts(pcVar10);
              free(piVar7);
              local_b8 = 0;
              pMiter = local_a0;
              vOutsPtr = local_a8;
              goto LAB_0031e1c5;
            }
            local_b4 = local_b4 + local_90->nSize;
            pMiter = local_a0;
            vOutsPtr = local_a8;
          }
        }
        Abc_NtkDelete(local_b0);
        lVar11 = lVar11 + 1;
      } while (lVar11 < __ptr_00->nSize);
    }
    printf(
          "                                                                                          \r"
          );
    if (0 < __ptr_00->nSize) {
      lVar11 = 0;
      do {
        __ptr = __ptr_00->pArray[lVar11];
        if (__ptr != (void *)0x0) {
          if (*(void **)((long)__ptr + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr + 8));
            *(undefined8 *)((long)__ptr + 8) = 0;
          }
          free(__ptr);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < __ptr_00->nSize);
    }
    if (__ptr_00->pArray != (void **)0x0) {
      free(__ptr_00->pArray);
      __ptr_00->pArray = (void **)0x0;
    }
    pAVar5 = local_98;
    if (__ptr_00 != (Vec_Ptr_t *)0x0) {
      free(__ptr_00);
    }
    if (vOutsPtr->pArray != (void **)0x0) {
      free(vOutsPtr->pArray);
      vOutsPtr->pArray = (void **)0x0;
    }
    free(vOutsPtr);
    pAVar8 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar8,"set progressbar");
    if (local_b8 == -1) {
      printf("Timed out after verifying %d outputs (out of %d).\n",(ulong)local_b4,
             (ulong)(uint)pAVar5->vCos->nSize);
      goto LAB_0031e29c;
    }
    if (local_b8 != 1) goto LAB_0031e29c;
    pcVar10 = "Networks are equivalent.                         ";
  }
  puts(pcVar10);
LAB_0031e29c:
  Abc_NtkDelete(pMiter);
  return;
}

Assistant:

void Abc_NtkCecFraigPartAuto( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int fVerbose )
{
    extern Vec_Ptr_t * Abc_NtkPartitionSmart( Abc_Ntk_t * pNtk, int nPartSizeLimit, int fVerbose );
    extern void Abc_NtkConvertCos( Abc_Ntk_t * pNtk, Vec_Int_t * vOuts, Vec_Ptr_t * vOnePtr );

    Vec_Ptr_t * vParts, * vOnePtr;
    Vec_Int_t * vOne;
    Prove_Params_t Params, * pParams = &Params;
    Abc_Ntk_t * pMiter, * pMiterPart;
    int i, RetValue, Status, nOutputs;

    // solve the CNF using the SAT solver
    Prove_ParamsSetDefault( pParams );
    pParams->nItersMax = 5;
    //    pParams->fVerbose = 1;

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 1, 1, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return;
    }
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent after structural hashing.\n" );
        Abc_NtkDelete( pMiter );
        return;
    }

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // partition the outputs
    vParts = Abc_NtkPartitionSmart( pMiter, 300, 0 );

    // fraig each partition
    Status = 1;
    nOutputs = 0;
    vOnePtr = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        // get this part of the miter
        Abc_NtkConvertCos( pMiter, vOne, vOnePtr );
        pMiterPart = Abc_NtkCreateConeArray( pMiter, vOnePtr, 0 );
        Abc_NtkCombinePos( pMiterPart, 0, 0 );
        // check the miter for being constant
        RetValue = Abc_NtkMiterIsConstant( pMiterPart );
        if ( RetValue == 0 )
        {
            printf( "Networks are NOT EQUIVALENT after partitioning.\n" );
            Abc_NtkDelete( pMiterPart );
            break;
        }
        if ( RetValue == 1 )
        {
            Abc_NtkDelete( pMiterPart );
            continue;
        }
        printf( "Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
            i+1, Vec_PtrSize(vParts), Abc_NtkPiNum(pMiterPart), Abc_NtkPoNum(pMiterPart), 
            Abc_NtkNodeNum(pMiterPart), Abc_AigLevel(pMiterPart) );
        fflush( stdout );
        // solve the problem
        RetValue = Abc_NtkIvyProve( &pMiterPart, pParams );
        if ( RetValue == -1 )
        {
            printf( "Networks are undecided (resource limits is reached).\r" );
            Status = -1;
        }
        else if ( RetValue == 0 )
        {
            int * pSimInfo = Abc_NtkVerifySimulatePattern( pMiterPart, pMiterPart->pModel );
            if ( pSimInfo[0] != 1 )
                printf( "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
            else
                printf( "Networks are NOT EQUIVALENT.                 \n" );
            ABC_FREE( pSimInfo );
            Status = 0;
            Abc_NtkDelete( pMiterPart );
            break;
        }
        else
        {
//            printf( "Finished part %5d (out of %5d)\r", i+1, Vec_PtrSize(vParts) );
            nOutputs += Vec_IntSize(vOne);
        }
        Abc_NtkDelete( pMiterPart );
    }
    printf( "                                                                                          \r" );
    Vec_VecFree( (Vec_Vec_t *)vParts );
    Vec_PtrFree( vOnePtr );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    if ( Status == 1 )
        printf( "Networks are equivalent.                         \n" );
    else if ( Status == -1 )
        printf( "Timed out after verifying %d outputs (out of %d).\n", nOutputs, Abc_NtkCoNum(pNtk1) );
    Abc_NtkDelete( pMiter );
}